

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

double SSIMGet_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint32_t *puVar6;
  double dVar7;
  VP8DistoStats local_48;
  
  local_48.w = 0;
  local_48.yym = 0;
  local_48.xym = 0;
  local_48.xxm = 0;
  local_48.ym = 0;
  local_48.xm = 0;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    puVar6 = kWeight;
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      bVar1 = src2[lVar4];
      iVar3 = *puVar6 * kWeight[lVar2] * (uint)src1[lVar4];
      local_48.xm = local_48.xm + iVar3;
      iVar5 = *puVar6 * kWeight[lVar2] * (uint)bVar1;
      local_48.ym = local_48.ym + iVar5;
      local_48.xxm = local_48.xxm + (uint)src1[lVar4] * iVar3;
      local_48.xym = local_48.xym + iVar3 * (uint)bVar1;
      local_48.yym = local_48.yym + iVar5 * (uint)bVar1;
      puVar6 = puVar6 + 1;
    }
    src1 = src1 + stride1;
    src2 = src2 + stride2;
  }
  dVar7 = VP8SSIMFromStats(&local_48);
  return dVar7;
}

Assistant:

static double SSIMGet_C(const uint8_t* src1, int stride1,
                        const uint8_t* src2, int stride2) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  int x, y;
  for (y = 0; y <= 2 * VP8_SSIM_KERNEL; ++y, src1 += stride1, src2 += stride2) {
    for (x = 0; x <= 2 * VP8_SSIM_KERNEL; ++x) {
      const uint32_t w = kWeight[x] * kWeight[y];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStats(&stats);
}